

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O2

void avro::codec_traits<uau::_union_array_union_Union__1__>::encode
               (Encoder *e,_union_array_union_Union__1__ *v)

{
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  local_30;
  
  (**(code **)(*(long *)e + 0xa0))(e,v->idx_);
  if (v->idx_ == 1) {
    uau::_union_array_union_Union__1__::get_array(&local_30,v);
    codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
    ::encode(e,&local_30);
    std::
    vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ::~vector(&local_30);
  }
  else if (v->idx_ == 0) {
    (**(code **)(*(long *)e + 0x20))(e);
    return;
  }
  return;
}

Assistant:

static void encode(Encoder& e, uau::_union_array_union_Union__1__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            e.encodeNull();
            break;
        case 1:
            avro::encode(e, v.get_array());
            break;
        }
    }